

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_1::SharedContextResetCase::iterate(SharedContextResetCase *this)

{
  EGLConfig *config;
  EGLDisplay *display;
  ostringstream *poVar1;
  ShaderType SVar2;
  TestLog *pTVar3;
  GLenum err;
  InfiniteLoop *this_00;
  RenderingContext contextA;
  RenderingContext contextB;
  EGLint attribListShared [9];
  Functions gl;
  RenderingContext local_1ae8;
  RenderingContext local_1ab8;
  EGLint local_1a88 [12];
  undefined1 local_1a58 [120];
  ios_base local_19e0 [6576];
  
  pTVar3 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  poVar1 = (ostringstream *)(local_1a58 + 8);
  local_1a58._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "A reset in one context will result in a reset in all other contexts in its share group\n\n"
             ,0x58);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_19e0);
  local_1a88[4] = 0x30bf;
  local_1a88[5] = 1;
  local_1a88[6] = 0x3138;
  local_1a88[7] = 0x31bf;
  local_1a88[0] = 0x3098;
  local_1a88[1] = 3;
  local_1a88[2] = 0x30fb;
  local_1a88[3] = 1;
  local_1a88[8] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,local_1a88);
  poVar1 = (ostringstream *)(local_1a58 + 8);
  local_1a58._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Create context A (share_context = EGL_NO_CONTEXT)",0x31);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_19e0);
  config = &(this->super_RobustnessTestCase).m_eglConfig;
  display = &(this->super_RobustnessTestCase).m_eglDisplay;
  local_1a58._0_8_ = (TestLog *)0x0;
  RenderingContext::RenderingContext
            (&local_1ae8,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1a88,
             config,display,(EGLContext *)local_1a58);
  poVar1 = (ostringstream *)(local_1a58 + 8);
  local_1a58._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Create context B (share_context = context A)",0x2c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_19e0);
  local_1a58._0_8_ = local_1ae8.m_context;
  RenderingContext::RenderingContext
            (&local_1ab8,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1a88,
             config,display,(EGLContext *)local_1a58);
  RenderingContext::makeCurrent
            (&local_1ae8,(EGLSurface *)(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions((Functions *)local_1a58);
  RenderingContext::initGLFunctions
            ((RenderingContext *)local_1ae8.m_eglTestCtx,(Functions *)local_1ae8.m_attribList);
  checkRequiredGLRobustnessExtension(local_1a88,(Functions *)local_1a58);
  this_00 = (InfiniteLoop *)operator_new(0x48);
  SVar2 = (this->super_RobustnessTestCase).m_params.m_shaderType;
  (this_00->super_ContextReset).m_gl = (Functions *)local_1a58;
  (this_00->super_ContextReset).m_log = pTVar3;
  (this_00->super_ContextReset).m_shaderType = SVar2;
  (this_00->super_ContextReset)._vptr_ContextReset = (_func_int **)&PTR__InfiniteLoop_021108e0;
  this_00->m_outputBuffer = 0;
  this_00->m_coordinatesBuffer = 0;
  this_00->m_coordLocation = 0;
  InfiniteLoop::setup(this_00);
  (*(this_00->super_ContextReset)._vptr_ContextReset[3])(this_00);
  (*(this_00->super_ContextReset)._vptr_ContextReset[4])(this_00);
  (*((this_00->super_ContextReset).m_gl)->finish)();
  err = (*((this_00->super_ContextReset).m_gl)->getError)();
  glu::checkError(err,"finish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x279);
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,QP_TEST_RESULT_PASS,"Pass");
  (*(this_00->super_ContextReset)._vptr_ContextReset[1])(this_00);
  RenderingContext::~RenderingContext(&local_1ab8);
  RenderingContext::~RenderingContext(&local_1ae8);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate	(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "A reset in one context will result in a reset in all other contexts in its share group\n\n"
			<< tcu::TestLog::EndMessage;

		// Create two share contexts with the same reset notification strategies
		const EGLint attribListShared[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribListShared);

		log << tcu::TestLog::Message << "Create context A (share_context = EGL_NO_CONTEXT)" << tcu::TestLog::EndMessage;
		RenderingContext contextA(m_eglTestCtx, attribListShared, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);

		log << tcu::TestLog::Message << "Create context B (share_context = context A)" << tcu::TestLog::EndMessage;
		RenderingContext contextB(m_eglTestCtx, attribListShared, m_eglConfig, m_eglDisplay, contextA.getContext());

		contextA.makeCurrent(m_eglSurface);

		glw::Functions gl;
		contextA.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribListShared, gl);

		DE_ASSERT(m_params.getContextResetType() == CONTEXTRESETTYPE_INFINITE_LOOP);
		de::UniquePtr<ContextReset> contextReset(new InfiniteLoop(gl, log, m_params.getShaderType()));

		contextReset->setup();
		contextReset->draw();

		try
		{
			contextReset->teardown();
			contextReset->finish();
		}
		catch (const glu::Error& error)
		{
			if (error.getError() == GL_CONTEXT_LOST)
			{
				contextB.makeCurrent(m_eglSurface);

				contextB.initGLFunctions(&gl);
				gl.getString(GL_VERSION); // arbitrary gl call

				if (gl.getError() != GL_CONTEXT_LOST)
				{
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! glGetError() returned wrong value. Expected GL_CONTEXT_LOST in context B");
					return STOP;
				}
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! glGetError() returned wrong value. Expected GL_CONTEXT_LOST in context A");
				return STOP;
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}